

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O2

int * __thiscall ImVector<int>::erase_unsorted(ImVector<int> *this,int *it)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  
  piVar2 = this->Data;
  if (piVar2 <= it) {
    iVar3 = this->Size;
    piVar1 = piVar2 + iVar3;
    if (it < piVar1) {
      lVar4 = (long)it - (long)piVar2;
      if (it < piVar1 + -1) {
        *(int *)((long)piVar2 + lVar4) = piVar1[-1];
        iVar3 = this->Size;
        piVar2 = this->Data;
      }
      this->Size = iVar3 + -1;
      return (int *)((long)piVar2 + lVar4);
    }
  }
  __assert_fail("it >= Data && it < Data + Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O2/_deps/imgui-src/imgui.h"
                ,0x71d,"T *ImVector<int>::erase_unsorted(const T *) [T = int]");
}

Assistant:

inline T*           erase_unsorted(const T* it)         { IM_ASSERT(it >= Data && it < Data + Size);  const ptrdiff_t off = it - Data; if (it < Data + Size - 1) memcpy(Data + off, Data + Size - 1, sizeof(T)); Size--; return Data + off; }